

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

CType * lj_cdata_index(CTState *cts,GCcdata *cd,cTValue *key,uint8_t **pp,CTInfo *qual)

{
  char cVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  CTSize CVar5;
  CType *pCVar6;
  CType *pCVar7;
  uint uVar8;
  ulong uVar9;
  GCcdata *pGVar10;
  GCstr *name;
  CType *ct;
  CTSize ofs;
  ptrdiff_t idx;
  uint local_64;
  CType *local_60;
  CTState *local_58;
  uint8_t **local_50;
  ulong local_48;
  GCcdata *local_40;
  cTValue *local_38;
  
  pGVar10 = cd + 1;
  uVar9 = (ulong)cd->ctypeid;
  uVar4 = cts->tab[uVar9].info;
  if ((uVar4 & 0xf0800000) == 0x20800000) {
    pGVar10 = (GCcdata *)(pGVar10->nextgc).gcptr64;
    uVar9 = (ulong)(uVar4 & 0xffff);
  }
  ct = cts->tab + uVar9;
  local_38 = key;
  do {
    uVar4 = ct->info;
    uVar8 = uVar4 >> 0x1c;
    if (uVar8 == 8) {
      pCVar7 = cts->tab;
      do {
        if ((uVar4 & 0xff0000) == 0x10000) {
          *qual = *qual | ct->size;
        }
        ct = pCVar7 + (ushort)ct->info;
        uVar4 = ct->info;
        uVar8 = uVar4 >> 0x1c;
      } while (uVar8 == 8);
    }
    dVar2 = (double)local_38->u64;
    uVar9 = (long)dVar2 >> 0x2f;
    pCVar7 = ct;
    if (uVar9 < 0xfffffffffffffff2) {
      local_48 = (ulong)local_38->n;
LAB_0014a472:
      if ((ct->info & 0xe0000000) == 0x20000000) {
        CVar5 = lj_ctype_size(cts,ct->info & 0xffff);
        if (CVar5 != 0xffffffff) {
          uVar4 = ct->info;
          if ((uVar4 & 0xf0000000) == 0x20000000) {
            if (ct->size == 4) {
              pGVar10 = (GCcdata *)(ulong)(uint)(pGVar10->nextgc).gcptr64;
            }
            else {
              pGVar10 = (GCcdata *)(pGVar10->nextgc).gcptr64;
            }
          }
          else if ((uVar4 & 0xc000000) != 0) {
            if ((uVar4 >> 0x1a & 1) != 0) {
              local_48 = local_48 & 1;
            }
            *(byte *)((long)qual + 3) = *(byte *)((long)qual + 3) | 2;
          }
          *pp = (uint8_t *)((long)&(pGVar10->nextgc).gcptr64 + (long)(int)CVar5 * local_48);
          return ct;
        }
        lj_err_caller(cts->L,LJ_ERR_FFI_INVSIZE);
      }
    }
    else if (uVar9 == 0xfffffffffffffffb) {
      name = (GCstr *)((ulong)dVar2 & 0x7fffffffffff);
      if (uVar8 == 1) {
        local_58 = (CTState *)cd;
        pCVar6 = lj_ctype_getfieldq(cts,ct,name,&local_64,qual);
        cd = (GCcdata *)local_58;
        if (pCVar6 == (CType *)0x0) goto LAB_0014a6ec;
        *pp = (uint8_t *)((long)&(pGVar10->nextgc).gcptr64 + (ulong)local_64);
        bVar3 = false;
        local_60 = pCVar6;
      }
      else {
        if ((uVar4 & 0xf4000000) == 0x34000000) {
          if (name->len == 2) {
            *(byte *)((long)qual + 3) = *(byte *)((long)qual + 3) | 2;
            cVar1 = (char)name[1].nextgc.gcptr64;
            if (cVar1 == 'i') {
              if (*(char *)((long)&name[1].nextgc.gcptr64 + 1) == 'm') {
                *pp = (uint8_t *)((long)&(pGVar10->nextgc).gcptr64 + (ulong)(ct->size >> 1));
                goto LAB_0014a6e3;
              }
            }
            else if ((cVar1 == 'r') && (*(char *)((long)&name[1].nextgc.gcptr64 + 1) == 'e')) {
              *pp = (uint8_t *)pGVar10;
LAB_0014a6e3:
              bVar3 = false;
              local_60 = ct;
              goto LAB_0014a6ee;
            }
          }
        }
        else if (*(uint16_t *)((long)&((CTState *)cd)->top + 2) == 0x16) {
          uVar4 = (uint)(pGVar10->nextgc).gcptr64;
          pCVar7 = cts->tab;
          pCVar6 = pCVar7 + uVar4;
          if ((pCVar7[uVar4].info & 0xf0000000) == 0x20000000) {
            pCVar6 = pCVar7 + (ushort)pCVar6->info;
          }
          bVar3 = true;
          pCVar7 = pCVar6;
          local_50 = pp;
          if ((pCVar6->info & 0xf0000000) == 0x10000000) {
            local_58 = (CTState *)cd;
            local_40 = pGVar10;
            pCVar7 = lj_ctype_getfieldq(cts,pCVar6,name,&local_64,(CTInfo *)0x0);
            if ((pCVar7 == (CType *)0x0) || ((pCVar7->info & 0xf0000000) != 0xb0000000)) {
              bVar3 = true;
            }
            else {
              bVar3 = false;
              local_60 = pCVar7;
            }
            pGVar10 = local_40;
            cd = (GCcdata *)local_58;
            pCVar7 = ct;
            if (bVar3) {
              pCVar7 = pCVar6;
            }
          }
          pp = local_50;
          ct = pCVar7;
          if (!bVar3) {
            bVar3 = false;
            goto LAB_0014a6ee;
          }
        }
LAB_0014a6ec:
        bVar3 = true;
        pCVar7 = ct;
      }
LAB_0014a6ee:
      if (!bVar3) {
        return local_60;
      }
    }
    else if (uVar9 == 0xfffffffffffffff5) {
      uVar9 = (ulong)*(ushort *)(((ulong)dVar2 & 0x7fffffffffff) + 10);
      pCVar6 = cts->tab;
      if ((pCVar6[uVar9].info & 0xf0000000) == 0x50000000) {
        uVar9 = (ulong)(pCVar6[uVar9].info & 0xffff);
      }
      if (pCVar6[uVar9].info < 0x4000000) {
        local_58 = cts;
        local_50 = pp;
        lj_cconv_ct_ct(cts,pCVar6 + 0xb,pCVar6 + uVar9,(uint8_t *)&local_48,
                       (uint8_t *)(((ulong)dVar2 & 0x7fffffffffff) + 0x10),0);
        pp = local_50;
        cts = local_58;
        goto LAB_0014a472;
      }
    }
    if (((pCVar7->info & 0xf0000000) != 0x20000000) ||
       ((cts->tab[(ushort)pCVar7->info].info & 0xf0000000) != 0x10000000)) {
      *(byte *)qual = (byte)*qual | 1;
      return pCVar7;
    }
    if (pCVar7->size == 4) {
      pGVar10 = (GCcdata *)(ulong)(uint)(pGVar10->nextgc).gcptr64;
    }
    else {
      pGVar10 = (GCcdata *)(pGVar10->nextgc).gcptr64;
    }
    ct = cts->tab + (pCVar7->info & 0xffff);
  } while( true );
}

Assistant:

CType *lj_cdata_index(CTState *cts, GCcdata *cd, cTValue *key, uint8_t **pp,
		      CTInfo *qual)
{
  uint8_t *p = (uint8_t *)cdataptr(cd);
  CType *ct = ctype_get(cts, cd->ctypeid);
  ptrdiff_t idx;

  /* Resolve reference for cdata object. */
  if (ctype_isref(ct->info)) {
    lj_assertCTS(ct->size == CTSIZE_PTR, "ref is not pointer-sized");
    p = *(uint8_t **)p;
    ct = ctype_child(cts, ct);
  }

collect_attrib:
  /* Skip attributes and collect qualifiers. */
  while (ctype_isattrib(ct->info)) {
    if (ctype_attrib(ct->info) == CTA_QUAL) *qual |= ct->size;
    ct = ctype_child(cts, ct);
  }
  /* Interning rejects refs to refs. */
  lj_assertCTS(!ctype_isref(ct->info), "bad ref of ref");

  if (tvisint(key)) {
    idx = (ptrdiff_t)intV(key);
    goto integer_key;
  } else if (tvisnum(key)) {  /* Numeric key. */
#ifdef _MSC_VER
    /* Workaround for MSVC bug. */
    volatile
#endif
    lua_Number n = numV(key);
    idx = LJ_64 ? (ptrdiff_t)n : (ptrdiff_t)lj_num2int(n);
  integer_key:
    if (ctype_ispointer(ct->info)) {
      CTSize sz = lj_ctype_size(cts, ctype_cid(ct->info));  /* Element size. */
      if (sz == CTSIZE_INVALID)
	lj_err_caller(cts->L, LJ_ERR_FFI_INVSIZE);
      if (ctype_isptr(ct->info)) {
	p = (uint8_t *)cdata_getptr(p, ct->size);
      } else if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
	if ((ct->info & CTF_COMPLEX)) idx &= 1;
	*qual |= CTF_CONST;  /* Valarray elements are constant. */
      }
      *pp = p + idx*(int32_t)sz;
      return ct;
    }
  } else if (tviscdata(key)) {  /* Integer cdata key. */
    GCcdata *cdk = cdataV(key);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    if (ctype_isenum(ctk->info)) ctk = ctype_child(cts, ctk);
    if (ctype_isinteger(ctk->info)) {
      lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT_PSZ), ctk,
		     (uint8_t *)&idx, cdataptr(cdk), 0);
      goto integer_key;
    }
  } else if (tvisstr(key)) {  /* String key. */
    GCstr *name = strV(key);
    if (ctype_isstruct(ct->info)) {
      CTSize ofs;
      CType *fct = lj_ctype_getfieldq(cts, ct, name, &ofs, qual);
      if (fct) {
	*pp = p + ofs;
	return fct;
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2) {
	*qual |= CTF_CONST;  /* Complex fields are constant. */
	if (strdata(name)[0] == 'r' && strdata(name)[1] == 'e') {
	  *pp = p;
	  return ct;
	} else if (strdata(name)[0] == 'i' && strdata(name)[1] == 'm') {
	  *pp = p + (ct->size >> 1);
	  return ct;
	}
      }
    } else if (cd->ctypeid == CTID_CTYPEID) {
      /* Allow indexing a (pointer to) struct constructor to get constants. */
      CType *sct = ctype_raw(cts, *(CTypeID *)p);
      if (ctype_isptr(sct->info))
	sct = ctype_rawchild(cts, sct);
      if (ctype_isstruct(sct->info)) {
	CTSize ofs;
	CType *fct = lj_ctype_getfield(cts, sct, name, &ofs);
	if (fct && ctype_isconstval(fct->info))
	  return fct;
      }
      ct = sct;  /* Allow resolving metamethods for constructors, too. */
    }
  }
  if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
    if (ctype_isstruct(ctype_rawchild(cts, ct)->info)) {
      p = (uint8_t *)cdata_getptr(p, ct->size);
      ct = ctype_child(cts, ct);
      goto collect_attrib;
    }
  }
  *qual |= 1;  /* Lookup failed. */
  return ct;  /* But return the resolved raw type. */
}